

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitSIMDShuffle
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,SIMDShuffle *curr
          )

{
  Literal *pLVar1;
  Literal right;
  undefined1 local_a0 [8];
  Flow flow;
  Literal left;
  
  visit((Flow *)local_a0,this,curr->left);
  if (flow.breakTo.super_IString.str._M_len == 0) {
    pLVar1 = Flow::getSingleValue((Flow *)local_a0);
    ::wasm::Literal::Literal((Literal *)&flow.breakTo.super_IString.str._M_str,pLVar1);
    visit((Flow *)&stack0xffffffffffffff18,this,curr->right);
    Flow::operator=((Flow *)local_a0,(Flow *)&stack0xffffffffffffff18);
    SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&stack0xffffffffffffff18);
    if (flow.breakTo.super_IString.str._M_len == 0) {
      pLVar1 = Flow::getSingleValue((Flow *)local_a0);
      ::wasm::Literal::Literal((Literal *)&stack0xffffffffffffff18,pLVar1);
      ::wasm::Literal::shuffleV8x16
                ((Literal *)&left.type,(array *)&flow.breakTo.super_IString.str._M_str);
      Flow::Flow(__return_storage_ptr__,(Literal *)&left.type);
      ::wasm::Literal::~Literal((Literal *)&left.type);
      ::wasm::Literal::~Literal((Literal *)&stack0xffffffffffffff18);
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)local_a0);
    }
    ::wasm::Literal::~Literal((Literal *)&flow.breakTo.super_IString.str._M_str);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_a0);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_a0);
  return __return_storage_ptr__;
}

Assistant:

Flow visitSIMDShuffle(SIMDShuffle* curr) {
    NOTE_ENTER("SIMDShuffle");
    Flow flow = self()->visit(curr->left);
    if (flow.breaking()) {
      return flow;
    }
    Literal left = flow.getSingleValue();
    flow = self()->visit(curr->right);
    if (flow.breaking()) {
      return flow;
    }
    Literal right = flow.getSingleValue();
    return left.shuffleV8x16(right, curr->mask);
  }